

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ActivationParams * __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::_internal_mutable_activation
          (SimpleRecurrentLayerParams *this)

{
  Arena *arena;
  ActivationParams *pAVar1;
  ActivationParams *p;
  SimpleRecurrentLayerParams *this_local;
  
  if (this->activation_ == (ActivationParams *)0x0) {
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pAVar1 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ActivationParams>(arena);
    this->activation_ = pAVar1;
  }
  return this->activation_;
}

Assistant:

inline ::CoreML::Specification::ActivationParams* SimpleRecurrentLayerParams::_internal_mutable_activation() {
  
  if (activation_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::ActivationParams>(GetArenaForAllocation());
    activation_ = p;
  }
  return activation_;
}